

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::Diffusion
          (Diffusion *this,Amr *Parent,NavierStokesBase *Caller,Diffusion *Coarser,int num_state,
          FluxRegister *Viscflux_reg,Vector<int,_std::allocator<int>_> *_is_diffusive)

{
  int iVar1;
  BoxArray *pBVar2;
  _Elt_pointer pbVar3;
  Long LVar4;
  int *piVar5;
  pointer in_RCX;
  size_t in_RDX;
  _Map_pointer in_RSI;
  AmrMesh *in_RDI;
  undefined4 in_R8D;
  pointer in_R9;
  IntVect IVar6;
  int i;
  int n_diff;
  ParmParse pp;
  ParmParse ppdiff;
  Diffusion *in_stack_00001050;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  allocator *this_00;
  undefined8 in_stack_fffffffffffffe88;
  string *prefix;
  int lev;
  size_type in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  int local_14c;
  allocator local_141;
  string local_140 [60];
  int in_stack_fffffffffffffefc;
  double *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  ParmParse *in_stack_ffffffffffffff10;
  undefined1 local_b1 [121];
  pointer local_38;
  undefined4 local_2c;
  pointer local_28;
  char *local_8;
  
  lev = (int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  (((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
     *)&in_RDI->_vptr_AmrMesh)->c).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = in_RSI;
  (in_RDI->super_AmrInfo).verbose = (int)in_RDX;
  (in_RDI->super_AmrInfo).max_level = (int)(in_RDX >> 0x20);
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  pBVar2 = amrex::AmrLevel::boxArray(*(AmrLevel **)&in_RDI->super_AmrInfo);
  ((iterator *)&(in_RDI->super_AmrInfo).ref_ratio)->_M_cur = (_Elt_pointer)pBVar2;
  pbVar3 = (_Elt_pointer)amrex::AmrLevel::DistributionMap(*(AmrLevel **)&in_RDI->super_AmrInfo);
  ((iterator *)&(in_RDI->super_AmrInfo).ref_ratio)->_M_first = pbVar3;
  iVar1 = amrex::AmrLevel::Level(*(AmrLevel **)&in_RDI->super_AmrInfo);
  *(int *)&((iterator *)&(in_RDI->super_AmrInfo).ref_ratio)->_M_last = iVar1;
  (in_RDI->super_AmrInfo).blocking_factor.
  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_start = local_28;
  (in_RDI->super_AmrInfo).blocking_factor.
  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined4 *)
   &(in_RDI->super_AmrInfo).blocking_factor.
    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_2c;
  amrex::IntVect::IntVect
            ((IntVect *)
             ((long)&(in_RDI->super_AmrInfo).blocking_factor.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  (in_RDI->super_AmrInfo).max_grid_size.
  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38;
  if (((anonymous_namespace)::initialized & 1) == 0) {
    verbose = 0;
    visc_tol = 1e-10;
    do_reflux = 1;
    scale_abec = 0;
    max_order = 2;
    tensor_max_order = 2;
    prefix = (string *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_b1 + 1),"diffuse",(allocator *)prefix);
    amrex::ParmParse::ParmParse((ParmParse *)in_RDI,prefix);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    this_00 = &local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"ns",this_00);
    amrex::ParmParse::ParmParse((ParmParse *)in_RDI,prefix);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    amrex::ParmParse::query
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(int *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc);
    do_reflux = (int)(do_reflux != 0);
    LVar4 = amrex::Vector<int,_std::allocator<int>_>::size
                      ((Vector<int,_std::allocator<int>_> *)0x5bd0f7);
    if ((int)LVar4 <
        *(int *)&(in_RDI->super_AmrInfo).blocking_factor.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
      local_8 = "Diffusion::Diffusion(): is_diffusive array is not long enough";
      amrex::Abort_host((char *)in_RDI);
    }
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe98);
    for (local_14c = 0; lev = (int)((ulong)prefix >> 0x20),
        local_14c <
        *(int *)&(in_RDI->super_AmrInfo).blocking_factor.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; local_14c = local_14c + 1) {
      piVar5 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)this_00,
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffe7c = *piVar5;
      piVar5 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)this_00,
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      *piVar5 = in_stack_fffffffffffffe7c;
    }
    echo_settings(in_stack_00001050);
    amrex::ExecOnFinalize((PTR_TO_VOID_FUNC)0x5bd27b);
    (anonymous_namespace)::initialized = 1;
    amrex::ParmParse::~ParmParse((ParmParse *)0x5bd28e);
    amrex::ParmParse::~ParmParse((ParmParse *)0x5bd29b);
  }
  if (0 < *(int *)&(in_RDI->super_AmrInfo).ref_ratio.
                   super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                   super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) {
    IVar6 = amrex::AmrMesh::refRatio(in_RDI,lev);
    *(long *)((long)&(in_RDI->super_AmrInfo).blocking_factor.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = IVar6.vect._0_8_;
    *(int *)((long)&(in_RDI->super_AmrInfo).max_grid_size.
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start + 4) = IVar6.vect[2];
    *(AmrMesh **)
     (in_RDI->super_AmrInfo).blocking_factor.
     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
     super__Vector_impl_data._M_start[4].vect = in_RDI;
  }
  return;
}

Assistant:

Diffusion::Diffusion (Amr*               Parent,
                      NavierStokesBase*  Caller,
                      Diffusion*         Coarser,
                      int                num_state,
                      FluxRegister*      Viscflux_reg,
                      const Vector<int>&  _is_diffusive)
    :
    parent(Parent),
    navier_stokes(Caller),
    grids(navier_stokes->boxArray()),
    dmap(navier_stokes->DistributionMap()),
    level(navier_stokes->Level()),
    coarser(Coarser),
    finer(0),
    NUM_STATE(num_state),
    viscflux_reg(Viscflux_reg)

{
    if (!initialized)
    {
        //
        // Set defaults here!!!
        //
        Diffusion::verbose             = 0;
        Diffusion::visc_tol            = 1.0e-10;
        Diffusion::do_reflux           = 1;
        Diffusion::scale_abec          = 0;
        //
        // It is essential that we set max_order of the solver to 2
        // if we want to use the standard sol(i)-sol(i-1) approximation
        // for the gradient at Dirichlet boundaries.
        // The solver's default order is 3 and this uses three points for the
        // gradient at a Dirichlet boundary.
        //
        Diffusion::max_order           = 2;
        Diffusion::tensor_max_order    = 2;

        ParmParse ppdiff("diffuse");

        ppdiff.query("v",                   verbose);
        ppdiff.query("scale_abec",          scale_abec);
        ppdiff.query("max_order",           max_order);
        ppdiff.query("tensor_max_order",    tensor_max_order);

        ppdiff.query("agglomeration", agglomeration);
        ppdiff.query("consolidation", consolidation);
        ppdiff.query("max_fmg_iter", max_fmg_iter);
#ifdef AMREX_USE_HYPRE
        ppdiff.query("use_hypre", use_hypre);
        ppdiff.query("hypre_verbose", hypre_verbose);
#endif

        ParmParse pp("ns");

        pp.query("visc_tol",  visc_tol);
        pp.query("do_reflux", do_reflux);

        do_reflux = (do_reflux ? 1 : 0);

        const int n_diff = _is_diffusive.size();

        if (n_diff < NUM_STATE)
            amrex::Abort("Diffusion::Diffusion(): is_diffusive array is not long enough");

        is_diffusive.resize(NUM_STATE);

        for (int i = 0; i < NUM_STATE; i++)
        {
            is_diffusive[i] = _is_diffusive[i];
        }

        echo_settings();

        amrex::ExecOnFinalize(Diffusion::Finalize);

        initialized = true;
    }

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
        coarser->finer = this;
    }
}